

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite.cpp
# Opt level: O2

bool spvtools::opt::ExtInsConflict
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *extIndices,Instruction *insInst
               ,uint32_t extOffset)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t i;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  puVar1 = (extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = Instruction::NumInOperands(insInst);
  if (((long)puVar1 - (long)puVar2 >> 2) - (ulong)extOffset == (ulong)(uVar4 - 2)) {
    bVar8 = false;
  }
  else {
    uVar6 = (int)((ulong)((long)(extIndices->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(extIndices->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2) - extOffset;
    uVar4 = Instruction::NumInOperands(insInst);
    uVar3 = uVar4 - 2;
    if (uVar6 <= uVar4 - 2) {
      uVar3 = uVar6;
    }
    uVar7 = 0;
    do {
      bVar8 = uVar3 == uVar7;
      if (bVar8) {
        return bVar8;
      }
      uVar4 = (extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[extOffset + (int)uVar7];
      uVar5 = Instruction::GetSingleWordInOperand(insInst,(int)uVar7 + 2);
      uVar7 = uVar7 + 1;
    } while (uVar4 == uVar5);
  }
  return bVar8;
}

Assistant:

bool ExtInsConflict(const std::vector<uint32_t>& extIndices,
                    const Instruction* insInst, const uint32_t extOffset) {
  if (extIndices.size() - extOffset == insInst->NumInOperands() - 2)
    return false;
  uint32_t extNumIndices = static_cast<uint32_t>(extIndices.size()) - extOffset;
  uint32_t insNumIndices = insInst->NumInOperands() - 2;
  uint32_t numIndices = std::min(extNumIndices, insNumIndices);
  for (uint32_t i = 0; i < numIndices; ++i)
    if (extIndices[i + extOffset] != insInst->GetSingleWordInOperand(i + 2))
      return false;
  return true;
}